

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O2

bool tinyusdz::WriteMaterialXToString(MtlxModel *mtlx,string *xml_str,string *warn,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  MtlxUsdPreviewSurface *pMVar3;
  ostream *poVar4;
  MtlxAutodeskStandardSurface *pMVar5;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  uint32_t n_12;
  uint32_t n_13;
  uint32_t n_14;
  uint32_t n_15;
  uint32_t n_16;
  uint32_t n_17;
  allocator local_221;
  string value_str;
  string local_200;
  string *local_1e0;
  string node_name;
  stringstream ss;
  ostream local_1a8 [376];
  
  pMVar3 = value::Value::as<tinyusdz::MtlxUsdPreviewSurface>(&mtlx->shader,false);
  if (pMVar3 == (MtlxUsdPreviewSurface *)0x0) {
    pMVar5 = value::Value::as<tinyusdz::MtlxAutodeskStandardSurface>(&mtlx->shader,false);
    if (pMVar5 == (MtlxAutodeskStandardSurface *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar4 = ::std::operator<<((ostream *)&ss,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"WriteMaterialXToString");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x3a3);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)&ss,"Unknown/unsupported shader: ");
      poVar4 = ::std::operator<<(poVar4,(string *)&mtlx->shader_name);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar4 = ::std::operator<<((ostream *)&ss,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"WriteMaterialXToString");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x3a0);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)&ss,"TODO: AutodeskStandardSurface");
    }
    ::std::operator<<(poVar4,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
    return false;
  }
  local_1e0 = xml_str;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  ::std::__cxx11::string::string((string *)&node_name,"SR_default",(allocator *)&value_str);
  ::std::operator<<(local_1a8,"<?xml version=\"1.0\"?>\n");
  ::std::operator<<(local_1a8,"<materialx version=\"1.38\" colorspace=\"lin_rec709\">\n");
  pprint::Indent_abi_cxx11_(&value_str,(pprint *)0x1,n);
  poVar4 = ::std::operator<<(local_1a8,(string *)&value_str);
  poVar4 = ::std::operator<<(poVar4,"<UsdPreviewSurface name=\"");
  poVar4 = ::std::operator<<(poVar4,(string *)&node_name);
  ::std::operator<<(poVar4,"\" type =\"surfaceshader\">\n");
  ::std::__cxx11::string::_M_dispose();
  paVar1 = &value_str.field_2;
  value_str._M_string_length = 0;
  value_str.field_2._M_local_buf[0] = '\0';
  value_str._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::string((string *)&local_200,"diffuseColor",&local_221);
  bVar2 = detail::SerializeAttribute<tinyusdz::value::color3f>
                    (&local_200,&(pMVar3->super_UsdPreviewSurface).diffuseColor,&value_str,err);
  ::std::__cxx11::string::_M_dispose();
  if (bVar2) {
    if (value_str._M_string_length != 0) {
      pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_00);
      poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
      poVar4 = ::std::operator<<(poVar4,"<input name=\"");
      poVar4 = ::std::operator<<(poVar4,"diffuseColor");
      poVar4 = ::std::operator<<(poVar4,"\" type=\"");
      poVar4 = ::std::operator<<(poVar4,"color3");
      poVar4 = ::std::operator<<(poVar4,"\" value=\"");
      poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
      ::std::operator<<(poVar4,"\" />\n");
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::string::_M_dispose();
    value_str._M_string_length = 0;
    value_str.field_2._M_local_buf[0] = '\0';
    value_str._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::string((string *)&local_200,"emissiveColor",&local_221);
    bVar2 = detail::SerializeAttribute<tinyusdz::value::color3f>
                      (&local_200,&(pMVar3->super_UsdPreviewSurface).emissiveColor,&value_str,err);
    ::std::__cxx11::string::_M_dispose();
    if (bVar2) {
      if (value_str._M_string_length != 0) {
        pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_01);
        poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
        poVar4 = ::std::operator<<(poVar4,"<input name=\"");
        poVar4 = ::std::operator<<(poVar4,"emissiveColor");
        poVar4 = ::std::operator<<(poVar4,"\" type=\"");
        poVar4 = ::std::operator<<(poVar4,"color3");
        poVar4 = ::std::operator<<(poVar4,"\" value=\"");
        poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
        ::std::operator<<(poVar4,"\" />\n");
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
      value_str._M_string_length = 0;
      value_str.field_2._M_local_buf[0] = '\0';
      value_str._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::string((string *)&local_200,"useSpecularWorkflow",&local_221);
      bVar2 = detail::SerializeAttribute<int>
                        (&local_200,&(pMVar3->super_UsdPreviewSurface).useSpecularWorkflow,
                         &value_str,err);
      ::std::__cxx11::string::_M_dispose();
      if (bVar2) {
        if (value_str._M_string_length != 0) {
          pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_02);
          poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
          poVar4 = ::std::operator<<(poVar4,"<input name=\"");
          poVar4 = ::std::operator<<(poVar4,"useSpecularWorkflow");
          poVar4 = ::std::operator<<(poVar4,"\" type=\"");
          poVar4 = ::std::operator<<(poVar4,"integer");
          poVar4 = ::std::operator<<(poVar4,"\" value=\"");
          poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
          ::std::operator<<(poVar4,"\" />\n");
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
        value_str._M_string_length = 0;
        value_str.field_2._M_local_buf[0] = '\0';
        value_str._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::string((string *)&local_200,"specularColor",&local_221);
        bVar2 = detail::SerializeAttribute<tinyusdz::value::color3f>
                          (&local_200,&(pMVar3->super_UsdPreviewSurface).specularColor,&value_str,
                           err);
        ::std::__cxx11::string::_M_dispose();
        if (bVar2) {
          if (value_str._M_string_length != 0) {
            pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_03);
            poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
            poVar4 = ::std::operator<<(poVar4,"<input name=\"");
            poVar4 = ::std::operator<<(poVar4,"specularColor");
            poVar4 = ::std::operator<<(poVar4,"\" type=\"");
            poVar4 = ::std::operator<<(poVar4,"color3");
            poVar4 = ::std::operator<<(poVar4,"\" value=\"");
            poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
            ::std::operator<<(poVar4,"\" />\n");
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::string::_M_dispose();
          value_str._M_string_length = 0;
          value_str.field_2._M_local_buf[0] = '\0';
          value_str._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::string((string *)&local_200,"metallic",&local_221);
          bVar2 = detail::SerializeAttribute<float>
                            (&local_200,&(pMVar3->super_UsdPreviewSurface).metallic,&value_str,err);
          ::std::__cxx11::string::_M_dispose();
          if (bVar2) {
            if (value_str._M_string_length != 0) {
              pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_04);
              poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
              poVar4 = ::std::operator<<(poVar4,"<input name=\"");
              poVar4 = ::std::operator<<(poVar4,"metallic");
              poVar4 = ::std::operator<<(poVar4,"\" type=\"");
              poVar4 = ::std::operator<<(poVar4,"float");
              poVar4 = ::std::operator<<(poVar4,"\" value=\"");
              poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
              ::std::operator<<(poVar4,"\" />\n");
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::string::_M_dispose();
            value_str._M_string_length = 0;
            value_str.field_2._M_local_buf[0] = '\0';
            value_str._M_dataplus._M_p = (pointer)paVar1;
            ::std::__cxx11::string::string((string *)&local_200,"roughness",&local_221);
            bVar2 = detail::SerializeAttribute<float>
                              (&local_200,&(pMVar3->super_UsdPreviewSurface).roughness,&value_str,
                               err);
            ::std::__cxx11::string::_M_dispose();
            if (bVar2) {
              if (value_str._M_string_length != 0) {
                pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_05);
                poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                poVar4 = ::std::operator<<(poVar4,"roughness");
                poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                poVar4 = ::std::operator<<(poVar4,"float");
                poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                ::std::operator<<(poVar4,"\" />\n");
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::string::_M_dispose();
              value_str._M_string_length = 0;
              value_str.field_2._M_local_buf[0] = '\0';
              value_str._M_dataplus._M_p = (pointer)paVar1;
              ::std::__cxx11::string::string((string *)&local_200,"clearcoat",&local_221);
              bVar2 = detail::SerializeAttribute<float>
                                (&local_200,&(pMVar3->super_UsdPreviewSurface).clearcoat,&value_str,
                                 err);
              ::std::__cxx11::string::_M_dispose();
              if (bVar2) {
                if (value_str._M_string_length != 0) {
                  pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_06);
                  poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                  poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                  poVar4 = ::std::operator<<(poVar4,"clearcoat");
                  poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                  poVar4 = ::std::operator<<(poVar4,"float");
                  poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                  poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                  ::std::operator<<(poVar4,"\" />\n");
                  ::std::__cxx11::string::_M_dispose();
                }
                ::std::__cxx11::string::_M_dispose();
                value_str._M_string_length = 0;
                value_str.field_2._M_local_buf[0] = '\0';
                value_str._M_dataplus._M_p = (pointer)paVar1;
                ::std::__cxx11::string::string((string *)&local_200,"clearcoatRoughness",&local_221)
                ;
                bVar2 = detail::SerializeAttribute<float>
                                  (&local_200,&(pMVar3->super_UsdPreviewSurface).clearcoatRoughness,
                                   &value_str,err);
                ::std::__cxx11::string::_M_dispose();
                if (bVar2) {
                  if (value_str._M_string_length != 0) {
                    pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_07);
                    poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                    poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                    poVar4 = ::std::operator<<(poVar4,"clearcoatRoughness");
                    poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                    poVar4 = ::std::operator<<(poVar4,"float");
                    poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                    poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                    ::std::operator<<(poVar4,"\" />\n");
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::string::_M_dispose();
                  value_str._M_string_length = 0;
                  value_str.field_2._M_local_buf[0] = '\0';
                  value_str._M_dataplus._M_p = (pointer)paVar1;
                  ::std::__cxx11::string::string((string *)&local_200,"opacity",&local_221);
                  bVar2 = detail::SerializeAttribute<float>
                                    (&local_200,&(pMVar3->super_UsdPreviewSurface).opacity,
                                     &value_str,err);
                  ::std::__cxx11::string::_M_dispose();
                  if (bVar2) {
                    if (value_str._M_string_length != 0) {
                      pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_08);
                      poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                      poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                      poVar4 = ::std::operator<<(poVar4,"opacity");
                      poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                      poVar4 = ::std::operator<<(poVar4,"float");
                      poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                      poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                      ::std::operator<<(poVar4,"\" />\n");
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::string::_M_dispose();
                    value_str._M_string_length = 0;
                    value_str.field_2._M_local_buf[0] = '\0';
                    value_str._M_dataplus._M_p = (pointer)paVar1;
                    ::std::__cxx11::string::string
                              ((string *)&local_200,"opacityThreshold",&local_221);
                    bVar2 = detail::SerializeAttribute<float>
                                      (&local_200,
                                       &(pMVar3->super_UsdPreviewSurface).opacityThreshold,
                                       &value_str,err);
                    ::std::__cxx11::string::_M_dispose();
                    if (bVar2) {
                      if (value_str._M_string_length != 0) {
                        pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_09);
                        poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                        poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                        poVar4 = ::std::operator<<(poVar4,"opacityThreshold");
                        poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                        poVar4 = ::std::operator<<(poVar4,"float");
                        poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                        poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                        ::std::operator<<(poVar4,"\" />\n");
                        ::std::__cxx11::string::_M_dispose();
                      }
                      ::std::__cxx11::string::_M_dispose();
                      value_str._M_string_length = 0;
                      value_str.field_2._M_local_buf[0] = '\0';
                      value_str._M_dataplus._M_p = (pointer)paVar1;
                      ::std::__cxx11::string::string((string *)&local_200,"ior",&local_221);
                      bVar2 = detail::SerializeAttribute<float>
                                        (&local_200,&(pMVar3->super_UsdPreviewSurface).ior,
                                         &value_str,err);
                      ::std::__cxx11::string::_M_dispose();
                      if (bVar2) {
                        if (value_str._M_string_length != 0) {
                          pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_10);
                          poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                          poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                          poVar4 = ::std::operator<<(poVar4,"ior");
                          poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                          poVar4 = ::std::operator<<(poVar4,"float");
                          poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                          poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                          ::std::operator<<(poVar4,"\" />\n");
                          ::std::__cxx11::string::_M_dispose();
                        }
                        ::std::__cxx11::string::_M_dispose();
                        value_str._M_string_length = 0;
                        value_str.field_2._M_local_buf[0] = '\0';
                        value_str._M_dataplus._M_p = (pointer)paVar1;
                        ::std::__cxx11::string::string((string *)&local_200,"normal",&local_221);
                        bVar2 = detail::SerializeAttribute<tinyusdz::value::normal3f>
                                          (&local_200,&(pMVar3->super_UsdPreviewSurface).normal,
                                           &value_str,err);
                        ::std::__cxx11::string::_M_dispose();
                        if (bVar2) {
                          if (value_str._M_string_length != 0) {
                            pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_11);
                            poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                            poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                            poVar4 = ::std::operator<<(poVar4,"normal");
                            poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                            poVar4 = ::std::operator<<(poVar4,"vector3");
                            poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                            poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                            ::std::operator<<(poVar4,"\" />\n");
                            ::std::__cxx11::string::_M_dispose();
                          }
                          ::std::__cxx11::string::_M_dispose();
                          value_str._M_string_length = 0;
                          value_str.field_2._M_local_buf[0] = '\0';
                          value_str._M_dataplus._M_p = (pointer)paVar1;
                          ::std::__cxx11::string::string
                                    ((string *)&local_200,"displacement",&local_221);
                          bVar2 = detail::SerializeAttribute<float>
                                            (&local_200,
                                             &(pMVar3->super_UsdPreviewSurface).displacement,
                                             &value_str,err);
                          ::std::__cxx11::string::_M_dispose();
                          if (bVar2) {
                            if (value_str._M_string_length != 0) {
                              pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_12);
                              poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                              poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                              poVar4 = ::std::operator<<(poVar4,"displacement");
                              poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                              poVar4 = ::std::operator<<(poVar4,"float");
                              poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                              poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                              ::std::operator<<(poVar4,"\" />\n");
                              ::std::__cxx11::string::_M_dispose();
                            }
                            ::std::__cxx11::string::_M_dispose();
                            value_str._M_string_length = 0;
                            value_str.field_2._M_local_buf[0] = '\0';
                            value_str._M_dataplus._M_p = (pointer)paVar1;
                            ::std::__cxx11::string::string
                                      ((string *)&local_200,"occlusion",&local_221);
                            bVar2 = detail::SerializeAttribute<float>
                                              (&local_200,
                                               &(pMVar3->super_UsdPreviewSurface).occlusion,
                                               &value_str,err);
                            ::std::__cxx11::string::_M_dispose();
                            if (bVar2) {
                              if (value_str._M_string_length != 0) {
                                pprint::Indent_abi_cxx11_(&local_200,(pprint *)0x2,n_13);
                                poVar4 = ::std::operator<<(local_1a8,(string *)&local_200);
                                poVar4 = ::std::operator<<(poVar4,"<input name=\"");
                                poVar4 = ::std::operator<<(poVar4,"occlusion");
                                poVar4 = ::std::operator<<(poVar4,"\" type=\"");
                                poVar4 = ::std::operator<<(poVar4,"float");
                                poVar4 = ::std::operator<<(poVar4,"\" value=\"");
                                poVar4 = ::std::operator<<(poVar4,(string *)&value_str);
                                ::std::operator<<(poVar4,"\" />\n");
                                ::std::__cxx11::string::_M_dispose();
                              }
                              ::std::__cxx11::string::_M_dispose();
                              pprint::Indent_abi_cxx11_(&value_str,(pprint *)0x1,n_14);
                              poVar4 = ::std::operator<<(local_1a8,(string *)&value_str);
                              ::std::operator<<(poVar4,"</UsdPreviewSurface>\n");
                              ::std::__cxx11::string::_M_dispose();
                              pprint::Indent_abi_cxx11_(&value_str,(pprint *)0x1,n_15);
                              poVar4 = ::std::operator<<(local_1a8,(string *)&value_str);
                              ::std::operator<<(poVar4,
                                                "<surfacematerial name=\"USD_Default\" type=\"material\">\n"
                                               );
                              ::std::__cxx11::string::_M_dispose();
                              pprint::Indent_abi_cxx11_(&value_str,(pprint *)0x2,n_16);
                              poVar4 = ::std::operator<<(local_1a8,(string *)&value_str);
                              poVar4 = ::std::operator<<(poVar4,
                                                  "<input name=\"surfaceshader\" type=\"surfaceshader\" nodename=\""
                                                  );
                              poVar4 = ::std::operator<<(poVar4,(string *)&node_name);
                              ::std::operator<<(poVar4,"\" />\n");
                              ::std::__cxx11::string::_M_dispose();
                              pprint::Indent_abi_cxx11_(&value_str,(pprint *)0x1,n_17);
                              poVar4 = ::std::operator<<(local_1a8,(string *)&value_str);
                              ::std::operator<<(poVar4,"</surfacematerial>\n");
                              ::std::__cxx11::string::_M_dispose();
                              ::std::operator<<(local_1a8,"</materialx>\n");
                              ::std::__cxx11::stringbuf::str();
                              ::std::__cxx11::string::operator=
                                        ((string *)local_1e0,(string *)&value_str);
                              ::std::__cxx11::string::_M_dispose();
                              bVar2 = true;
                              goto LAB_00240645;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  ::std::__cxx11::string::_M_dispose();
  bVar2 = false;
LAB_00240645:
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar2;
}

Assistant:

bool WriteMaterialXToString(const MtlxModel &mtlx, std::string &xml_str,
                            std::string *warn, std::string *err) {
  if (auto usdps = mtlx.shader.as<MtlxUsdPreviewSurface>()) {
    return detail::WriteMaterialXToString(*usdps, xml_str, warn, err);
  } else if (auto adskss = mtlx.shader.as<MtlxAutodeskStandardSurface>()) {
    (void)adskss;
    // TODO
    PUSH_ERROR_AND_RETURN("TODO: AutodeskStandardSurface");
  } else {
    // TODO
    PUSH_ERROR_AND_RETURN("Unknown/unsupported shader: " << mtlx.shader_name);
  }

  return false;
}